

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O3

int LZWDecodeCompat(TIFF *tif,uint8_t *op0,tmsize_t occ0,uint16_t s)

{
  byte *pbVar1;
  uint8_t *puVar2;
  long *plVar3;
  uint8_t *puVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint8_t *puVar11;
  char *fmt;
  ulong uVar12;
  ulong uVar13;
  char *module;
  ulong uVar14;
  ulong uVar15;
  tmsize_t tVar16;
  long *plVar17;
  byte *pbVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong local_58;
  long *local_40;
  
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                  ,0x32f,"int LZWDecodeCompat(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar10 = *(long *)(puVar2 + 0xa8);
  uVar9 = occ0;
  if (lVar10 != 0) {
    plVar17 = *(long **)(puVar2 + 200);
    lVar5 = (ulong)*(ushort *)(plVar17 + 1) - lVar10;
    uVar9 = occ0 - lVar5;
    if (occ0 < lVar5) {
      *(long *)(puVar2 + 0xa8) = lVar10 + occ0;
      lVar10 = lVar5;
      do {
        plVar17 = (long *)*plVar17;
        lVar10 = lVar10 + -1;
      } while (occ0 < lVar10);
      uVar9 = 0;
      tVar16 = occ0;
      do {
        op0[tVar16 + -1] = *(uint8_t *)((long)plVar17 + 0xb);
        plVar17 = (long *)*plVar17;
        tVar16 = tVar16 + -1;
      } while (tVar16 != 0);
    }
    else {
      lVar10 = lVar5;
      do {
        op0[lVar10 + -1] = *(uint8_t *)((long)plVar17 + 0xb);
        plVar17 = (long *)*plVar17;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      puVar2[0xa8] = '\0';
      puVar2[0xa9] = '\0';
      puVar2[0xaa] = '\0';
      puVar2[0xab] = '\0';
      puVar2[0xac] = '\0';
      puVar2[0xad] = '\0';
      puVar2[0xae] = '\0';
      puVar2[0xaf] = '\0';
      op0 = op0 + lVar5;
    }
    if (occ0 < lVar5) {
      return 1;
    }
  }
  pbVar18 = tif->tif_rawcp;
  uVar13 = (tif->tif_rawcc - *(long *)(puVar2 + 0xb8)) * 8 + *(long *)(puVar2 + 0xb0);
  *(ulong *)(puVar2 + 0xb0) = uVar13;
  uVar20 = (ulong)*(ushort *)(puVar2 + 0x80);
  uVar12 = *(ulong *)(puVar2 + 0x88);
  lVar10 = *(long *)(puVar2 + 0x90);
  local_58 = *(ulong *)(puVar2 + 0xa0);
  local_40 = *(long **)(puVar2 + 0xd8);
  plVar17 = *(long **)(puVar2 + 0xe0);
  plVar7 = *(long **)(puVar2 + 0xd0);
joined_r0x002a99ac:
  do {
    puVar4 = op0;
    uVar21 = uVar13;
    if ((long)uVar9 < 1) goto LAB_002a9cfa;
    iVar19 = (int)uVar20;
    uVar21 = uVar13 - uVar20;
    if (uVar13 < uVar20) {
      TIFFWarningExtR(tif,"LZWDecodeCompat","LZWDecode: Strip %u not terminated with EOI code",
                      (ulong)tif->tif_curstrip);
      uVar21 = uVar13;
      goto LAB_002a9cfa;
    }
    uVar14 = (ulong)*pbVar18 << ((byte)lVar10 & 0x3f) | uVar12;
    lVar5 = lVar10 + 8;
    if (lVar5 < (long)uVar20) {
      pbVar1 = pbVar18 + 1;
      pbVar18 = pbVar18 + 2;
      uVar14 = uVar14 | (ulong)*pbVar1 << ((byte)lVar5 & 0x3f);
      lVar5 = lVar10 + 0x10;
    }
    else {
      pbVar18 = pbVar18 + 1;
    }
    uVar12 = uVar14 >> ((byte)uVar20 & 0x3f);
    uVar14 = uVar14 & local_58;
    lVar10 = lVar5 - uVar20;
    uVar8 = (uint)uVar14 & 0xffff;
    if (uVar8 == 0x100) {
      do {
        local_40 = (long *)(*(long *)(puVar2 + 0xe8) + 0x1020);
        _TIFFmemset(local_40,0,0x12fd0);
        uVar13 = uVar21 - 9;
        if (uVar21 < 9) {
          lVar5 = *(long *)(puVar2 + 0xe8);
          TIFFWarningExtR(tif,"LZWDecodeCompat","LZWDecode: Strip %u not terminated with EOI code",
                          (ulong)tif->tif_curstrip);
          goto LAB_002a9cf7;
        }
        uVar14 = (ulong)*pbVar18 << ((byte)lVar10 & 0x3f) | uVar12;
        lVar5 = lVar10 + 8;
        if (lVar10 < 1) {
          pbVar1 = pbVar18 + 1;
          pbVar18 = pbVar18 + 2;
          uVar14 = uVar14 | (ulong)*pbVar1 << ((byte)lVar5 & 0x3f);
          lVar5 = lVar10 + 0x10;
        }
        else {
          pbVar18 = pbVar18 + 1;
        }
        uVar8 = (uint)uVar14 & 0x1ff;
        uVar12 = uVar14 >> 9;
        lVar10 = lVar5 + -9;
        uVar21 = uVar13;
      } while (uVar8 == 0x100);
      if (uVar8 == 0x101) {
        lVar5 = *(long *)(puVar2 + 0xe8);
LAB_002a9cf7:
        plVar17 = (long *)(lVar5 + 0x1ff0);
        local_58 = 0x1ff;
        uVar20 = 9;
        goto LAB_002a9cfa;
      }
      if (0x100 < uVar8) {
        module = tif->tif_name;
        uVar9 = (ulong)tif->tif_row;
        fmt = "LZWDecode: Corrupted LZW table at scanline %u";
LAB_002a9e6b:
        TIFFErrorExtR(tif,module,fmt,uVar9);
        return 0;
      }
      plVar17 = (long *)(*(long *)(puVar2 + 0xe8) + 0x1ff0);
      *puVar4 = (uint8_t)uVar14;
      local_58 = 0x1ff;
      uVar20 = 9;
      plVar7 = (long *)((ulong)(((uint)uVar14 & 0x1ff) << 4) + *(long *)(puVar2 + 0xe8));
      op0 = puVar4 + 1;
      uVar9 = uVar9 - 1;
      goto joined_r0x002a99ac;
    }
    if (uVar8 == 0x101) goto LAB_002a9cfa;
    plVar3 = *(long **)(puVar2 + 0xe8);
    if ((((local_40 < plVar3) || (plVar3 + 0x27fe <= local_40)) ||
        (*local_40 = (long)plVar7, plVar7 < plVar3)) || (plVar3 + 0x27fe <= plVar7)) {
      uVar9 = (ulong)tif->tif_row;
      module = "LZWDecodeCompat";
      fmt = "Corrupted LZW table at scanline %u";
      goto LAB_002a9e6b;
    }
    plVar6 = (long *)((ulong)(((uint)uVar14 & 0xffff) << 4) + (long)plVar3);
    *(undefined1 *)((long)local_40 + 10) = *(undefined1 *)((long)plVar7 + 10);
    *(short *)(local_40 + 1) = (short)(int)plVar7[1] + 1;
    plVar7 = local_40;
    if (plVar6 < local_40) {
      plVar7 = plVar6;
    }
    *(undefined1 *)((long)local_40 + 0xb) = *(undefined1 *)((long)plVar7 + 10);
    local_40 = local_40 + 2;
    if (plVar17 < local_40) {
      if (10 < iVar19) {
        iVar19 = 0xb;
      }
      uVar20 = (ulong)(iVar19 + 1U);
      local_58 = ~(-1L << ((byte)(iVar19 + 1U) & 0x3f));
      plVar17 = plVar3 + local_58 * 2;
    }
    plVar7 = plVar6;
    uVar13 = uVar21;
    if ((uVar14 & 0xff00) != 0) {
      uVar14 = (ulong)*(ushort *)(plVar6 + 1);
      if (uVar14 == 0) {
        uVar9 = (ulong)tif->tif_row;
        module = "LZWDecodeCompat";
        fmt = "Wrong length of decoded string: data probably corrupted at scanline %u";
        goto LAB_002a9e6b;
      }
      uVar15 = uVar9 - uVar14;
      if (uVar14 <= uVar9) {
        puVar11 = puVar4 + uVar14;
        do {
          puVar11 = puVar11 + -1;
          *puVar11 = *(uint8_t *)((long)plVar6 + 0xb);
          plVar6 = (long *)*plVar6;
          op0 = puVar4 + uVar14;
          uVar9 = uVar15;
          if (plVar6 == (long *)0x0) break;
        } while (puVar4 < puVar11);
        goto joined_r0x002a99ac;
      }
      *(long **)(puVar2 + 200) = plVar6;
      do {
        plVar6 = (long *)*plVar6;
      } while ((ushort)uVar9 < *(ushort *)(plVar6 + 1));
      *(ulong *)(puVar2 + 0xa8) = uVar9;
      uVar13 = uVar9;
      do {
        puVar4[uVar13 - 1] = *(uint8_t *)((long)plVar6 + 0xb);
        plVar6 = (long *)*plVar6;
        uVar13 = uVar13 - 1;
        uVar9 = 0;
      } while (uVar13 != 0);
LAB_002a9cfa:
      puVar4 = tif->tif_rawcp;
      lVar5 = tif->tif_rawcc;
      tif->tif_rawcc = (tmsize_t)(puVar4 + (lVar5 - (long)pbVar18));
      tif->tif_rawcp = pbVar18;
      *(uint8_t **)(puVar2 + 0xb8) = puVar4 + (lVar5 - (long)pbVar18);
      *(ulong *)(puVar2 + 0xb0) = uVar21;
      *(short *)(puVar2 + 0x80) = (short)uVar20;
      *(ulong *)(puVar2 + 0x88) = uVar12;
      *(long *)(puVar2 + 0x90) = lVar10;
      *(ulong *)(puVar2 + 0xa0) = local_58;
      *(long **)(puVar2 + 0xd0) = plVar7;
      *(long **)(puVar2 + 0xd8) = local_40;
      *(long **)(puVar2 + 0xe0) = plVar17;
      if (0 < (long)uVar9) {
        TIFFErrorExtR(tif,"LZWDecodeCompat","Not enough data at scanline %u (short %lu bytes)",
                      (ulong)tif->tif_row);
        return 0;
      }
      return 1;
    }
    *puVar4 = (uint8_t)uVar14;
    op0 = puVar4 + 1;
    uVar9 = uVar9 - 1;
  } while( true );
}

Assistant:

static int LZWDecodeCompat(TIFF *tif, uint8_t *op0, tmsize_t occ0, uint16_t s)
{
    static const char module[] = "LZWDecodeCompat";
    LZWCodecState *sp = DecoderState(tif);
    uint8_t *op = (uint8_t *)op0;
    tmsize_t occ = occ0;
    uint8_t *tp;
    uint8_t *bp;
    int code, nbits;
    int len;
    long nextbits, nbitsmask;
    WordType nextdata;
    code_t *codep, *free_entp, *maxcodep, *oldcodep;

    (void)s;
    assert(sp != NULL);

    /*
     * Restart interrupted output operation.
     */
    if (sp->dec_restart)
    {
        tmsize_t residue;

        codep = sp->dec_codep;
        residue = codep->length - sp->dec_restart;
        if (residue > occ)
        {
            /*
             * Residue from previous decode is sufficient
             * to satisfy decode request.  Skip to the
             * start of the decoded string, place decoded
             * values in the output buffer, and return.
             */
            sp->dec_restart += occ;
            do
            {
                codep = codep->next;
            } while (--residue > occ);
            tp = op + occ;
            do
            {
                *--tp = codep->value;
                codep = codep->next;
            } while (--occ);
            return (1);
        }
        /*
         * Residue satisfies only part of the decode request.
         */
        op += residue;
        occ -= residue;
        tp = op;
        do
        {
            *--tp = codep->value;
            codep = codep->next;
        } while (--residue);
        sp->dec_restart = 0;
    }

    bp = (uint8_t *)tif->tif_rawcp;

    sp->dec_bitsleft += (((uint64_t)tif->tif_rawcc - sp->old_tif_rawcc) << 3);
    uint64_t dec_bitsleft = sp->dec_bitsleft;

    nbits = sp->lzw_nbits;
    nextdata = sp->lzw_nextdata;
    nextbits = sp->lzw_nextbits;
    nbitsmask = sp->dec_nbitsmask;
    oldcodep = sp->dec_oldcodep;
    free_entp = sp->dec_free_entp;
    maxcodep = sp->dec_maxcodep;

    while (occ > 0)
    {
        NextCode(tif, sp, bp, code, GetNextCodeCompat, dec_bitsleft);
        if (code == CODE_EOI)
            break;
        if (code == CODE_CLEAR)
        {
            do
            {
                free_entp = sp->dec_codetab + CODE_FIRST;
                _TIFFmemset(free_entp, 0,
                            (CSIZE - CODE_FIRST) * sizeof(code_t));
                nbits = BITS_MIN;
                nbitsmask = MAXCODE(BITS_MIN);
                maxcodep = sp->dec_codetab + nbitsmask;
                NextCode(tif, sp, bp, code, GetNextCodeCompat, dec_bitsleft);
            } while (code == CODE_CLEAR); /* consecutive CODE_CLEAR codes */
            if (code == CODE_EOI)
                break;
            if (code > CODE_CLEAR)
            {
                TIFFErrorExtR(
                    tif, tif->tif_name,
                    "LZWDecode: Corrupted LZW table at scanline %" PRIu32,
                    tif->tif_row);
                return (0);
            }
            *op++ = (uint8_t)code;
            occ--;
            oldcodep = sp->dec_codetab + code;
            continue;
        }
        codep = sp->dec_codetab + code;

        /*
         * Add the new entry to the code table.
         */
        if (free_entp < &sp->dec_codetab[0] ||
            free_entp >= &sp->dec_codetab[CSIZE])
        {
            TIFFErrorExtR(tif, module,
                          "Corrupted LZW table at scanline %" PRIu32,
                          tif->tif_row);
            return (0);
        }

        free_entp->next = oldcodep;
        if (free_entp->next < &sp->dec_codetab[0] ||
            free_entp->next >= &sp->dec_codetab[CSIZE])
        {
            TIFFErrorExtR(tif, module,
                          "Corrupted LZW table at scanline %" PRIu32,
                          tif->tif_row);
            return (0);
        }
        free_entp->firstchar = free_entp->next->firstchar;
        free_entp->length = free_entp->next->length + 1;
        free_entp->value =
            (codep < free_entp) ? codep->firstchar : free_entp->firstchar;
        if (++free_entp > maxcodep)
        {
            if (++nbits > BITS_MAX) /* should not happen */
                nbits = BITS_MAX;
            nbitsmask = MAXCODE(nbits);
            maxcodep = sp->dec_codetab + nbitsmask;
        }
        oldcodep = codep;
        if (code >= 256)
        {
            /*
             * Code maps to a string, copy string
             * value to output (written in reverse).
             */
            if (codep->length == 0)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Wrong length of decoded "
                    "string: data probably corrupted at scanline %" PRIu32,
                    tif->tif_row);
                return (0);
            }
            if (codep->length > occ)
            {
                /*
                 * String is too long for decode buffer,
                 * locate portion that will fit, copy to
                 * the decode buffer, and setup restart
                 * logic for the next decoding call.
                 */
                sp->dec_codep = codep;
                do
                {
                    codep = codep->next;
                } while (codep->length > occ);
                sp->dec_restart = occ;
                tp = op + occ;
                do
                {
                    *--tp = codep->value;
                    codep = codep->next;
                } while (--occ);
                break;
            }
            len = codep->length;
            tp = op + len;
            do
            {
                *--tp = codep->value;
                codep = codep->next;
            } while (codep && tp > op);
            assert(occ >= len);
            op += len;
            occ -= len;
        }
        else
        {
            *op++ = (uint8_t)code;
            occ--;
        }
    }

    tif->tif_rawcc -= (tmsize_t)((uint8_t *)bp - tif->tif_rawcp);
    tif->tif_rawcp = (uint8_t *)bp;

    sp->old_tif_rawcc = tif->tif_rawcc;
    sp->dec_bitsleft = dec_bitsleft;

    sp->lzw_nbits = (unsigned short)nbits;
    sp->lzw_nextdata = nextdata;
    sp->lzw_nextbits = nextbits;
    sp->dec_nbitsmask = nbitsmask;
    sp->dec_oldcodep = oldcodep;
    sp->dec_free_entp = free_entp;
    sp->dec_maxcodep = maxcodep;

    if (occ > 0)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at scanline %" PRIu32 " (short %" PRIu64
                      " bytes)",
                      tif->tif_row, (uint64_t)occ);
        return (0);
    }
    return (1);
}